

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbndmat.h
# Opt level: O0

void __thiscall TPZFBMatrix<int>::TPZFBMatrix(TPZFBMatrix<int> *this,TPZFBMatrix<int> *param_2)

{
  int64_t iVar1;
  long in_RSI;
  TPZManVector<int,_5> *in_RDI;
  TPZManVector<int,_5> *unaff_retaddr;
  void **in_stack_ffffffffffffffd8;
  TPZVec<int> *in_stack_ffffffffffffffe0;
  TPZManVector<int,_5> *copy;
  
  copy = in_RDI;
  TPZMatrix<int>::TPZMatrix
            ((TPZMatrix<int> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             (TPZMatrix<int> *)in_RDI);
  (((TPZBaseMatrix *)&in_RDI->super_TPZVec<int>)->super_TPZSavable)._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFBMatrix_02424c00;
  TPZVec<int>::TPZVec(in_stack_ffffffffffffffe0,(TPZVec<int> *)in_RDI->fExtAlloc);
  iVar1 = *(int64_t *)(in_RSI + 0x48);
  in_RDI[1].super_TPZVec<int>.fStore = *(int **)(in_RSI + 0x40);
  in_RDI[1].super_TPZVec<int>.fNElements = iVar1;
  TPZManVector<int,_5>::TPZManVector(unaff_retaddr,copy);
  return;
}

Assistant:

TPZFBMatrix (const TPZFBMatrix<TVar> & ) = default;